

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread.c
# Opt level: O0

void evthread_debug_lock_mark_locked(uint mode,debug_lock *lock)

{
  unsigned_long uVar1;
  unsigned_long me;
  debug_lock *lock_local;
  uint mode_local;
  
  if (lock->signature != 0xdeb0b10c) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evthread.c"
               ,0xec,"DEBUG_LOCK_SIG == lock->signature","evthread_debug_lock_mark_locked");
  }
  lock->count = lock->count + 1;
  if (((lock->locktype & 1) == 0) && (lock->count != 1)) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evthread.c"
               ,0xef,"lock->count == 1","evthread_debug_lock_mark_locked");
  }
  if (evthread_id_fn_ != (_func_unsigned_long *)0x0) {
    uVar1 = (*evthread_id_fn_)();
    if ((1 < lock->count) && (lock->held_by != uVar1)) {
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evthread.c"
                 ,0xf4,"lock->held_by == me","evthread_debug_lock_mark_locked");
    }
    lock->held_by = uVar1;
  }
  return;
}

Assistant:

static void
evthread_debug_lock_mark_locked(unsigned mode, struct debug_lock *lock)
{
	EVUTIL_ASSERT(DEBUG_LOCK_SIG == lock->signature);
	++lock->count;
	if (!(lock->locktype & EVTHREAD_LOCKTYPE_RECURSIVE))
		EVUTIL_ASSERT(lock->count == 1);
	if (evthread_id_fn_) {
		unsigned long me;
		me = evthread_id_fn_();
		if (lock->count > 1)
			EVUTIL_ASSERT(lock->held_by == me);
		lock->held_by = me;
	}
}